

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueType.cpp
# Opt level: O2

bool __thiscall ValueType::IsNotNativeArray(ValueType *this)

{
  bool bVar1;
  ObjectType OVar2;
  bool bVar3;
  
  bVar1 = IsNotObject(this);
  bVar3 = true;
  if (!bVar1) {
    if (((this->field_0).bits & (Object|Null|Undefined|Likely)) == Object) {
      OVar2 = GetObjectType(this);
      if ((OVar2 != ObjectWithArray) && (OVar2 = GetObjectType(this), OVar2 != Array)) {
        return true;
      }
      bVar1 = HasVarElements(this);
      return bVar1;
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool ValueType::IsNotNativeArray() const
{
    return
        IsNotObject() ||
        (
            IsObject() &&
            ((GetObjectType() != ObjectType::ObjectWithArray && GetObjectType() != ObjectType::Array) || HasVarElements())
        );
}